

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O0

void PrintInstruction(OutputContext *ctx,char *constantData,ExternFuncInfo *functionData,
                     char *symbolData,RegVmInstructionCode code,uchar rA,uchar rB,uchar rC,
                     uint argument,VmConstant *constant)

{
  char *pcVar1;
  uchar rA_local;
  RegVmInstructionCode code_local;
  char *symbolData_local;
  ExternFuncInfo *functionData_local;
  char *constantData_local;
  OutputContext *ctx_local;
  
  pcVar1 = GetInstructionName(code);
  Print(ctx,"%s ",pcVar1);
  switch(code) {
  case rviNop:
    break;
  case rviLoadByte:
  case rviLoadWord:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintAddress(ctx,constantData,rC,argument,constant,VM_TYPE_VOID);
    break;
  case rviLoadDword:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintAddress(ctx,constantData,rC,argument,constant,VM_TYPE_INT);
    break;
  case rviLoadLong:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintAddress(ctx,constantData,rC,argument,constant,VM_TYPE_LONG);
    break;
  case rviLoadFloat:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintAddress(ctx,constantData,rC,argument,constant,VM_TYPE_VOID);
    break;
  case rviLoadDouble:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintAddress(ctx,constantData,rC,argument,constant,VM_TYPE_DOUBLE);
    break;
  case rviLoadImm:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintConstant(ctx,argument,constant);
    break;
  case rviStoreByte:
  case rviStoreWord:
  case rviStoreDword:
  case rviStoreLong:
  case rviStoreFloat:
  case rviStoreDouble:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintAddress(ctx,constantData,rC,argument,constant,VM_TYPE_VOID);
    break;
  case rviCombinedd:
  case rviBreakupdd:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    break;
  case rviMov:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    switch(rB) {
    case '\0':
      Print(ctx," (full)");
      break;
    case '\x01':
      Print(ctx," (int)");
      break;
    case '\x02':
      Print(ctx," (double)");
      break;
    case '\x03':
      Print(ctx," (long)");
      break;
    default:
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                    ,0x174,
                    "void PrintInstruction(OutputContext &, char *, ExternFuncInfo *, char *, RegVmInstructionCode, unsigned char, unsigned char, unsigned char, unsigned int, VmConstant *)"
                   );
    }
    break;
  case rviMovMult:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    switch(rB & 3) {
    case 0:
      Print(ctx," (full)");
      break;
    case 1:
      Print(ctx," (int)");
      break;
    case 2:
      Print(ctx," (double)");
      break;
    case 3:
      Print(ctx," (long)");
      break;
    default:
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                    ,0x18b,
                    "void PrintInstruction(OutputContext &, char *, ExternFuncInfo *, char *, RegVmInstructionCode, unsigned char, unsigned char, unsigned char, unsigned int, VmConstant *)"
                   );
    }
    if (argument >> 0x18 != 0) {
      Print(ctx,"; ");
      PrintRegister(ctx,argument._3_1_);
      Print(ctx,", ");
      PrintRegister(ctx,argument._2_1_);
      switch(rB >> 2 & 3) {
      case 0:
        Print(ctx," (full)");
        break;
      case 1:
        Print(ctx," (int)");
        break;
      case 2:
        Print(ctx," (double)");
        break;
      case 3:
        Print(ctx," (long)");
        break;
      default:
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                      ,0x1a4,
                      "void PrintInstruction(OutputContext &, char *, ExternFuncInfo *, char *, RegVmInstructionCode, unsigned char, unsigned char, unsigned char, unsigned int, VmConstant *)"
                     );
      }
    }
    if ((argument >> 8 & 0xff) != 0) {
      Print(ctx,"; ");
      PrintRegister(ctx,argument._1_1_);
      Print(ctx,", ");
      PrintRegister(ctx,(uchar)argument);
      switch(rB >> 4 & 3) {
      case 0:
        Print(ctx," (full)");
        break;
      case 1:
        Print(ctx," (int)");
        break;
      case 2:
        Print(ctx," (double)");
        break;
      case 3:
        Print(ctx," (long)");
        break;
      default:
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                      ,0x1be,
                      "void PrintInstruction(OutputContext &, char *, ExternFuncInfo *, char *, RegVmInstructionCode, unsigned char, unsigned char, unsigned char, unsigned int, VmConstant *)"
                     );
      }
    }
    break;
  case rviDtoi:
  case rviDtol:
  case rviDtof:
  case rviItod:
  case rviLtod:
  case rviItol:
  case rviLtoi:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    break;
  case rviIndex:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    Print(ctx,", ");
    if (constant == (VmConstant *)0x0) {
      PrintRegister(ctx,argument._2_1_);
      Print(ctx,", %d",(ulong)(argument & 0xffff));
    }
    else {
      PrintRegister(ctx,(uchar)((uint)constant->iValue >> 0x10));
      Print(ctx,", %d",(ulong)(constant->iValue & 0xffff));
    }
    break;
  case rviGetAddr:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintAddress(ctx,constantData,rC,argument,constant,VM_TYPE_VOID);
    break;
  case rviSetRange:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    switch(rB) {
    case '\0':
      Print(ctx,"double");
      break;
    case '\x01':
      Print(ctx,"float");
      break;
    case '\x02':
      Print(ctx,"long");
      break;
    case '\x03':
      Print(ctx,"int");
      break;
    case '\x04':
      Print(ctx,"short");
      break;
    case '\x05':
      Print(ctx,"char");
      break;
    default:
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                    ,0x1fe,
                    "void PrintInstruction(OutputContext &, char *, ExternFuncInfo *, char *, RegVmInstructionCode, unsigned char, unsigned char, unsigned char, unsigned int, VmConstant *)"
                   );
    }
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    Print(ctx,", ");
    PrintConstant(ctx,argument,constant);
    break;
  case rviMemCopy:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    Print(ctx,", ");
    PrintConstant(ctx,argument,constant);
    break;
  case rviJmp:
    PrintConstant(ctx,argument,constant);
    break;
  case rviJmpz:
  case rviJmpnz:
    PrintRegister(ctx,rC);
    Print(ctx,", ");
    PrintConstant(ctx,argument,constant);
    break;
  case rviCall:
    if (constant == (VmConstant *)0x0) {
      if (functionData == (ExternFuncInfo *)0x0) {
        Print(ctx,"%d",(ulong)argument);
      }
      else {
        Print(ctx,"%s#%d",symbolData + functionData[argument].offsetToName,(ulong)argument);
      }
    }
    else {
      PrintConstant(ctx,constant);
    }
    PrintCall(ctx,constantData,(uint)rA << 0x10 | (uint)rB << 8 | (uint)rC);
    break;
  case rviCallPtr:
    PrintRegister(ctx,rC);
    PrintCall(ctx,constantData,argument);
    break;
  case rviReturn:
    if (rC != '\0') {
      Print(ctx,"checked ");
    }
    switch(rB) {
    case '\0':
      Print(ctx,"void");
      break;
    case '\x01':
      Print(ctx,"double");
      break;
    case '\x02':
      Print(ctx,"long");
      break;
    case '\x03':
      Print(ctx,"int");
      break;
    case '\x04':
      Print(ctx,"struct");
      break;
    case '\x05':
      Print(ctx,"error");
      break;
    default:
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                    ,0x23d,
                    "void PrintInstruction(OutputContext &, char *, ExternFuncInfo *, char *, RegVmInstructionCode, unsigned char, unsigned char, unsigned char, unsigned int, VmConstant *)"
                   );
    }
    if (rB != '\x05') {
      PrintReturn(ctx,constantData,argument);
    }
    break;
  case rviAddImm:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
    Print(ctx,", ");
    PrintConstant(ctx,argument,constant);
    break;
  case rviAdd:
  case rviSub:
  case rviMul:
  case rviDiv:
  case rviPow:
  case rviMod:
  case rviLess:
  case rviGreater:
  case rviLequal:
  case rviGequal:
  case rviEqual:
  case rviNequal:
  case rviShl:
  case rviShr:
  case rviBitAnd:
  case rviBitOr:
  case rviBitXor:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
    Print(ctx,", ");
    PrintAddress(ctx,constantData,rC,argument,constant,VM_TYPE_INT);
    break;
  case rviAddImml:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
    Print(ctx,", ");
    PrintConstant(ctx,argument,constant);
    break;
  case rviAddl:
  case rviSubl:
  case rviMull:
  case rviDivl:
  case rviPowl:
  case rviModl:
  case rviLessl:
  case rviGreaterl:
  case rviLequall:
  case rviGequall:
  case rviEquall:
  case rviNequall:
  case rviShll:
  case rviShrl:
  case rviBitAndl:
  case rviBitOrl:
  case rviBitXorl:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
    Print(ctx,", ");
    PrintAddress(ctx,constantData,rC,argument,constant,VM_TYPE_LONG);
    break;
  case rviAddd:
  case rviSubd:
  case rviMuld:
  case rviDivd:
  case rviAddf:
  case rviSubf:
  case rviMulf:
  case rviDivf:
  case rviPowd:
  case rviModd:
  case rviLessd:
  case rviGreaterd:
  case rviLequald:
  case rviGequald:
  case rviEquald:
  case rviNequald:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
    Print(ctx,", ");
    PrintAddress(ctx,constantData,rC,argument,constant,VM_TYPE_DOUBLE);
    break;
  case rviNeg:
  case rviNegl:
  case rviNegd:
  case rviBitNot:
  case rviBitNotl:
  case rviLogNot:
  case rviLogNotl:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    break;
  case rviConvertPtr:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintRegister(ctx,rB);
    Print(ctx,", ");
    PrintRegister(ctx,rC);
    Print(ctx,", ");
    PrintConstant(ctx,argument,constant);
    break;
  case rviFuncAddr:
  case rviTypeid:
    PrintRegister(ctx,rA);
    Print(ctx,", ");
    PrintConstant(ctx,argument,constant);
    break;
  default:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                  ,0x2b0,
                  "void PrintInstruction(OutputContext &, char *, ExternFuncInfo *, char *, RegVmInstructionCode, unsigned char, unsigned char, unsigned char, unsigned int, VmConstant *)"
                 );
  }
  return;
}

Assistant:

void PrintInstruction(OutputContext &ctx, char *constantData, ExternFuncInfo *functionData, char *symbolData, RegVmInstructionCode code, unsigned char rA, unsigned char rB, unsigned char rC, unsigned argument, VmConstant *constant)
{
	Print(ctx, "%s ", GetInstructionName(code));

	switch(code)
	{
	case rviNop:
		break;
	case rviLoadByte:
	case rviLoadWord:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_VOID);
		break;
	case rviLoadDword:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_INT);
		break;
	case rviLoadLong:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_LONG);
		break;
	case rviLoadFloat:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_VOID);
		break;
	case rviLoadDouble:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_DOUBLE);
		break;
	case rviLoadImm:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviStoreByte:
	case rviStoreWord:
	case rviStoreDword:
	case rviStoreLong:
	case rviStoreFloat:
	case rviStoreDouble:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_VOID);
		break;
	case rviCombinedd:
	case rviBreakupdd:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		break;
	case rviMov:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);

		switch(rB)
		{
		case rvcFull:
			Print(ctx, " (full)");
			break;
		case rvcInt:
			Print(ctx, " (int)");
			break;
		case rvcDouble:
			Print(ctx, " (double)");
			break;
		case rvcLong:
			Print(ctx, " (long)");
			break;
		default:
			assert(!"unknown type");
		}
		break;
	case rviMovMult:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);

		switch(rB & 0x3)
		{
		case rvcFull:
			Print(ctx, " (full)");
			break;
		case rvcInt:
			Print(ctx, " (int)");
			break;
		case rvcDouble:
			Print(ctx, " (double)");
			break;
		case rvcLong:
			Print(ctx, " (long)");
			break;
		default:
			assert(!"unknown type");
		}

		if(argument >> 24)
		{
			Print(ctx, "; ");
			PrintRegister(ctx, argument >> 24);
			Print(ctx, ", ");
			PrintRegister(ctx, (argument >> 16) & 0xff);

			switch((rB >> 2) & 0x3)
			{
			case rvcFull:
				Print(ctx, " (full)");
				break;
			case rvcInt:
				Print(ctx, " (int)");
				break;
			case rvcDouble:
				Print(ctx, " (double)");
				break;
			case rvcLong:
				Print(ctx, " (long)");
				break;
			default:
				assert(!"unknown type");
			}
		}

		if((argument >> 8) & 0xff)
		{
			Print(ctx, "; ");
			PrintRegister(ctx, (argument >> 8) & 0xff);
			Print(ctx, ", ");
			PrintRegister(ctx, argument & 0xff);

			switch((rB >> 4) & 0x3)
			{
			case rvcFull:
				Print(ctx, " (full)");
				break;
			case rvcInt:
				Print(ctx, " (int)");
				break;
			case rvcDouble:
				Print(ctx, " (double)");
				break;
			case rvcLong:
				Print(ctx, " (long)");
				break;
			default:
				assert(!"unknown type");
			}
		}
		break;
	case rviDtoi:
	case rviDtol:
	case rviDtof:
	case rviItod:
	case rviLtod:
	case rviItol:
	case rviLtoi:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		break;
	case rviIndex:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		Print(ctx, ", ");

		if(constant)
		{
			PrintRegister(ctx, (constant->iValue >> 16) & 0xff);
			Print(ctx, ", %d", constant->iValue & 0xffff);
		}
		else
		{
			PrintRegister(ctx, (argument >> 16) & 0xff);
			Print(ctx, ", %d", argument & 0xffff);
		}
		break;
	case rviGetAddr:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_VOID);
		break;
	case rviSetRange:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");

		switch(rB)
		{
		case rvsrDouble:
			Print(ctx, "double");
			break;
		case rvsrFloat:
			Print(ctx, "float");
			break;
		case rvsrLong:
			Print(ctx, "long");
			break;
		case rvsrInt:
			Print(ctx, "int");
			break;
		case rvsrShort:
			Print(ctx, "short");
			break;
		case rvsrChar:
			Print(ctx, "char");
			break;
		default:
			assert(!"unknown type");
		}

		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviMemCopy:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviJmp:
		PrintConstant(ctx, argument, constant);
		break;
	case rviJmpz:
	case rviJmpnz:
		PrintRegister(ctx, rC);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviCall:
		if(constant)
			PrintConstant(ctx, constant);
		else if (functionData)
			Print(ctx, "%s#%d", functionData[argument].offsetToName + symbolData, argument);
		else
			Print(ctx, "%d", argument);

		PrintCall(ctx, constantData, (rA << 16) | (rB << 8) | rC);
		break;
	case rviCallPtr:
		PrintRegister(ctx, rC);
		PrintCall(ctx, constantData, argument);
		break;
	case rviReturn:
		if(rC)
			Print(ctx, "checked ");

		switch(rB)
		{
		case rvrVoid:
			Print(ctx, "void");
			break;
		case rvrDouble:
			Print(ctx, "double");
			break;
		case rvrLong:
			Print(ctx, "long");
			break;
		case rvrInt:
			Print(ctx, "int");
			break;
		case rvrStruct:
			Print(ctx, "struct");
			break;
		case rvrError:
			Print(ctx, "error");
			break;
		default:
			assert(!"unknown type");
		}

		if(rB != rvrError)
			PrintReturn(ctx, constantData, argument);
		break;
	case rviAddImm:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviAdd:
	case rviSub:
	case rviMul:
	case rviDiv:
	case rviPow:
	case rviMod:
	case rviLess:
	case rviGreater:
	case rviLequal:
	case rviGequal:
	case rviEqual:
	case rviNequal:
	case rviShl:
	case rviShr:
	case rviBitAnd:
	case rviBitOr:
	case rviBitXor:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_INT);
		break;
	case rviAddImml:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviAddl:
	case rviSubl:
	case rviMull:
	case rviDivl:
	case rviPowl:
	case rviModl:
	case rviLessl:
	case rviGreaterl:
	case rviLequall:
	case rviGequall:
	case rviEquall:
	case rviNequall:
	case rviShll:
	case rviShrl:
	case rviBitAndl:
	case rviBitOrl:
	case rviBitXorl:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_LONG);
		break;
	case rviAddd:
	case rviSubd:
	case rviMuld:
	case rviDivd:
	case rviAddf:
	case rviSubf:
	case rviMulf:
	case rviDivf:
	case rviPowd:
	case rviModd:
	case rviLessd:
	case rviGreaterd:
	case rviLequald:
	case rviGequald:
	case rviEquald:
	case rviNequald:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintAddress(ctx, constantData, rC, argument, constant, VM_TYPE_DOUBLE);
		break;
	case rviNeg:
	case rviNegl:
	case rviNegd:
	case rviBitNot:
	case rviBitNotl:
	case rviLogNot:
	case rviLogNotl:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		break;
	case rviConvertPtr:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintRegister(ctx, rB);
		Print(ctx, ", ");
		PrintRegister(ctx, rC);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	case rviFuncAddr:
	case rviTypeid:
		PrintRegister(ctx, rA);
		Print(ctx, ", ");
		PrintConstant(ctx, argument, constant);
		break;
	default:
		assert(!"unknown instruction");
	}
}